

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall
duckdb_parquet::ColumnCryptoMetaData::printTo(ColumnCryptoMetaData *this,ostream *out)

{
  _ColumnCryptoMetaData__isset _Var1;
  string local_60;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"ColumnCryptoMetaData(",0x15);
  std::__ostream_insert<char,std::char_traits<char>>(out,"ENCRYPTION_WITH_FOOTER_KEY=",0x1b);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::EncryptionWithFooterKey>
              (&local_40,&this->ENCRYPTION_WITH_FOOTER_KEY);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  }
  if ((((byte)_Var1 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2)) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"ENCRYPTION_WITH_COLUMN_KEY=",0x1b);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::EncryptionWithColumnKey>
              (&local_60,&this->ENCRYPTION_WITH_COLUMN_KEY);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_60._M_dataplus._M_p,local_60._M_string_length);
  }
  if ((((byte)_Var1 & 2) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2)) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void ColumnCryptoMetaData::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "ColumnCryptoMetaData(";
  out << "ENCRYPTION_WITH_FOOTER_KEY="; (__isset.ENCRYPTION_WITH_FOOTER_KEY ? (out << to_string(ENCRYPTION_WITH_FOOTER_KEY)) : (out << "<null>"));
  out << ", " << "ENCRYPTION_WITH_COLUMN_KEY="; (__isset.ENCRYPTION_WITH_COLUMN_KEY ? (out << to_string(ENCRYPTION_WITH_COLUMN_KEY)) : (out << "<null>"));
  out << ")";
}